

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O2

void aom_highbd_lpf_horizontal_8_dual_sse2
               (uint16_t *s,int p,uint8_t *_blimit0,uint8_t *_limit0,uint8_t *_thresh0,
               uint8_t *_blimit1,uint8_t *_limit1,uint8_t *_thresh1,int bd)

{
  undefined1 (*pauVar1) [16];
  uint16_t *puVar2;
  __m128i *palVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  longlong lVar14;
  longlong lVar15;
  unkbyte10 Var16;
  unkbyte10 Var17;
  __m128i alVar18;
  __m128i alVar19;
  __m128i alVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  short sVar26;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar35;
  short sVar37;
  undefined1 auVar27 [16];
  short sVar39;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  ushort uVar41;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  ushort uVar51;
  undefined1 auVar44 [16];
  undefined1 auVar52 [16];
  short sVar53;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  undefined1 auVar54 [16];
  short sVar64;
  short sVar65;
  short sVar66;
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar72;
  short sVar73;
  undefined1 auVar74 [16];
  short sVar75;
  short sVar77;
  short sVar78;
  short sVar79;
  short sVar80;
  short sVar81;
  short sVar82;
  short sVar83;
  undefined1 auVar76 [16];
  ushort uVar84;
  ushort uVar87;
  short sVar88;
  ushort uVar89;
  short sVar90;
  ushort uVar91;
  short sVar92;
  ushort uVar93;
  ushort uVar94;
  short sVar95;
  ushort uVar96;
  short sVar97;
  undefined1 auVar85 [16];
  ushort uVar98;
  undefined1 auVar86 [16];
  short sVar99;
  short sVar101;
  short sVar102;
  short sVar103;
  short sVar104;
  short sVar105;
  short sVar106;
  undefined1 auVar100 [16];
  short sVar107;
  short sVar108;
  short sVar109;
  short sVar110;
  short local_1a8;
  short sStack_1a6;
  short sStack_1a4;
  short sStack_1a2;
  short sStack_1a0;
  short sStack_19e;
  short sStack_19c;
  short sStack_19a;
  short local_198;
  short sStack_196;
  short sStack_194;
  short sStack_192;
  short sStack_190;
  short sStack_18e;
  short sStack_18c;
  short sStack_18a;
  __m128i local_128;
  undefined1 local_118 [16];
  __m128i local_108;
  undefined1 local_f8 [16];
  ushort local_e8;
  ushort uStack_e6;
  ushort uStack_e4;
  ushort uStack_e2;
  ushort uStack_e0;
  ushort uStack_de;
  ushort uStack_dc;
  ushort uStack_da;
  short local_d8;
  short sStack_d6;
  short sStack_d4;
  short sStack_d2;
  short sStack_d0;
  short sStack_ce;
  short sStack_cc;
  short sStack_ca;
  __m128i t80;
  short local_b8;
  short sStack_b6;
  short sStack_b4;
  short sStack_b2;
  short sStack_b0;
  short sStack_ae;
  short sStack_ac;
  short sStack_aa;
  __m128i thresh0;
  __m128i limit0;
  __m128i blimit0;
  __m128i local_78;
  undefined1 local_68 [16];
  __m128i p_1 [2];
  short sVar34;
  short sVar36;
  short sVar38;
  short sVar40;
  
  pauVar1 = (undefined1 (*) [16])(s + -(long)(p * 4));
  uVar4 = *(undefined8 *)*pauVar1;
  uVar5 = *(undefined8 *)(*pauVar1 + 8);
  auVar28 = *pauVar1;
  auVar43 = *pauVar1;
  lVar23 = (long)(p * 3);
  pauVar1 = (undefined1 (*) [16])(s + lVar23);
  uVar6 = *(undefined8 *)*pauVar1;
  uVar7 = *(undefined8 *)(*pauVar1 + 8);
  auVar52 = *pauVar1;
  auVar86 = *pauVar1;
  pauVar1 = (undefined1 (*) [16])(s + -lVar23);
  uVar8 = *(undefined8 *)*pauVar1;
  uVar9 = *(undefined8 *)(*pauVar1 + 8);
  auVar29 = *pauVar1;
  auVar54 = *pauVar1;
  lVar22 = (long)(p * 2);
  pauVar1 = (undefined1 (*) [16])(s + lVar22);
  uVar10 = *(undefined8 *)*pauVar1;
  uVar11 = *(undefined8 *)(*pauVar1 + 8);
  auVar74 = *pauVar1;
  auVar85 = *pauVar1;
  puVar2 = s + -lVar22;
  uVar12 = *(undefined8 *)puVar2;
  uVar13 = *(undefined8 *)(puVar2 + 4);
  Var16 = *(unkbyte10 *)puVar2;
  local_1a8 = (short)uVar12;
  sStack_1a6 = (short)((ulong)uVar12 >> 0x10);
  sStack_1a4 = (short)((ulong)uVar12 >> 0x20);
  sStack_1a2 = (short)((ulong)uVar12 >> 0x30);
  sStack_1a0 = (short)uVar13;
  sStack_19e = (short)((ulong)uVar13 >> 0x10);
  sStack_19c = (short)((ulong)uVar13 >> 0x20);
  sStack_19a = (short)((ulong)uVar13 >> 0x30);
  lVar21 = (long)p;
  puVar2 = s + lVar21;
  uVar12 = *(undefined8 *)puVar2;
  uVar13 = *(undefined8 *)(puVar2 + 4);
  Var17 = *(unkbyte10 *)puVar2;
  local_198 = (short)uVar12;
  sStack_196 = (short)((ulong)uVar12 >> 0x10);
  sStack_194 = (short)((ulong)uVar12 >> 0x20);
  sStack_192 = (short)((ulong)uVar12 >> 0x30);
  sStack_190 = (short)uVar13;
  sStack_18e = (short)((ulong)uVar13 >> 0x10);
  sStack_18c = (short)((ulong)uVar13 >> 0x20);
  sStack_18a = (short)((ulong)uVar13 >> 0x30);
  palVar3 = (__m128i *)(s + -lVar21);
  lVar14 = (*palVar3)[0];
  lVar15 = (*palVar3)[1];
  alVar20 = *palVar3;
  alVar18 = *palVar3;
  uVar12 = *(undefined8 *)s;
  uVar13 = *(undefined8 *)(s + 4);
  auVar44 = *(undefined1 (*) [16])s;
  alVar19 = *(__m128i *)s;
  get_limit_dual(_blimit0,_limit0,_thresh0,_blimit1,_limit1,_thresh1,bd,&blimit0,&limit0,&thresh0,
                 &t80);
  auVar24 = psubusw((undefined1  [16])alVar18,(undefined1  [16])alVar19);
  auVar27 = psubusw((undefined1  [16])alVar19,(undefined1  [16])alVar18);
  p_1[1][1]._2_2_ = sStack_19e;
  p_1[1]._0_10_ = Var16;
  p_1[1][1]._4_2_ = sStack_19c;
  p_1[1][1]._6_2_ = sStack_19a;
  local_68._10_2_ = sStack_18e;
  local_68._0_10_ = Var17;
  local_68._12_2_ = sStack_18c;
  local_68._14_2_ = sStack_18a;
  auVar25 = psubusw((undefined1  [16])p_1[1],local_68);
  auVar42 = psubusw(local_68,(undefined1  [16])p_1[1]);
  auVar42 = auVar42 | auVar25;
  auVar24 = paddusw(auVar27 | auVar24,auVar27 | auVar24);
  auVar25._0_2_ = auVar42._0_2_ >> 1;
  auVar25._2_2_ = auVar42._2_2_ >> 1;
  auVar25._4_2_ = auVar42._4_2_ >> 1;
  auVar25._6_2_ = auVar42._6_2_ >> 1;
  auVar25._8_2_ = auVar42._8_2_ >> 1;
  auVar25._10_2_ = auVar42._10_2_ >> 1;
  auVar25._12_2_ = auVar42._12_2_ >> 1;
  auVar25._14_2_ = auVar42._14_2_ >> 1;
  auVar25 = paddusw(auVar25,auVar24);
  auVar25 = auVar25 ^ _DAT_00430140;
  auVar24 = _DAT_00430140 ^ (undefined1  [16])blimit0;
  auVar27._0_2_ = -(ushort)(auVar24._0_2_ < auVar25._0_2_);
  auVar27._2_2_ = -(ushort)(auVar24._2_2_ < auVar25._2_2_);
  auVar27._4_2_ = -(ushort)(auVar24._4_2_ < auVar25._4_2_);
  auVar27._6_2_ = -(ushort)(auVar24._6_2_ < auVar25._6_2_);
  auVar27._8_2_ = -(ushort)(auVar24._8_2_ < auVar25._8_2_);
  auVar27._10_2_ = -(ushort)(auVar24._10_2_ < auVar25._10_2_);
  auVar27._12_2_ = -(ushort)(auVar24._12_2_ < auVar25._12_2_);
  auVar27._14_2_ = -(ushort)(auVar24._14_2_ < auVar25._14_2_);
  auVar24 = paddusw((undefined1  [16])limit0,_DAT_00430120);
  auVar24 = auVar24 & auVar27;
  auVar25 = psubusw(auVar43,auVar54);
  auVar27 = psubusw(auVar54,auVar43);
  auVar27 = auVar27 | auVar25;
  auVar25 = psubusw(auVar54,(undefined1  [16])p_1[1]);
  auVar43 = psubusw((undefined1  [16])p_1[1],auVar54);
  auVar43 = auVar43 | auVar25;
  sVar26 = auVar27._0_2_;
  sVar56 = auVar43._0_2_;
  uVar41 = (ushort)(sVar56 < sVar26) * sVar26 | (ushort)(sVar56 >= sVar26) * sVar56;
  sVar26 = auVar27._2_2_;
  sVar56 = auVar43._2_2_;
  uVar45 = (ushort)(sVar56 < sVar26) * sVar26 | (ushort)(sVar56 >= sVar26) * sVar56;
  sVar26 = auVar27._4_2_;
  sVar56 = auVar43._4_2_;
  uVar46 = (ushort)(sVar56 < sVar26) * sVar26 | (ushort)(sVar56 >= sVar26) * sVar56;
  sVar26 = auVar27._6_2_;
  sVar56 = auVar43._6_2_;
  uVar47 = (ushort)(sVar56 < sVar26) * sVar26 | (ushort)(sVar56 >= sVar26) * sVar56;
  sVar26 = auVar27._8_2_;
  sVar56 = auVar43._8_2_;
  uVar48 = (ushort)(sVar56 < sVar26) * sVar26 | (ushort)(sVar56 >= sVar26) * sVar56;
  sVar26 = auVar27._10_2_;
  sVar56 = auVar43._10_2_;
  uVar49 = (ushort)(sVar56 < sVar26) * sVar26 | (ushort)(sVar56 >= sVar26) * sVar56;
  sVar26 = auVar27._12_2_;
  sVar56 = auVar43._12_2_;
  sVar30 = auVar43._14_2_;
  uVar50 = (ushort)(sVar56 < sVar26) * sVar26 | (ushort)(sVar56 >= sVar26) * sVar56;
  sVar26 = auVar27._14_2_;
  uVar51 = (ushort)(sVar30 < sVar26) * sVar26 | (ushort)(sVar30 >= sVar26) * sVar30;
  auVar43 = psubusw((undefined1  [16])p_1[1],(undefined1  [16])alVar18);
  auVar54 = psubusw((undefined1  [16])alVar18,(undefined1  [16])p_1[1]);
  auVar54 = auVar54 | auVar43;
  auVar43 = psubusw(local_68,(undefined1  [16])alVar19);
  auVar25 = psubusw((undefined1  [16])alVar19,local_68);
  auVar25 = auVar25 | auVar43;
  sVar26 = auVar54._0_2_;
  sVar56 = auVar25._0_2_;
  local_e8 = (ushort)(sVar56 < sVar26) * sVar26 | (ushort)(sVar56 >= sVar26) * sVar56;
  sVar26 = auVar54._2_2_;
  sVar56 = auVar25._2_2_;
  uStack_e6 = (ushort)(sVar56 < sVar26) * sVar26 | (ushort)(sVar56 >= sVar26) * sVar56;
  sVar26 = auVar54._4_2_;
  sVar56 = auVar25._4_2_;
  uStack_e4 = (ushort)(sVar56 < sVar26) * sVar26 | (ushort)(sVar56 >= sVar26) * sVar56;
  sVar26 = auVar54._6_2_;
  sVar56 = auVar25._6_2_;
  uStack_e2 = (ushort)(sVar56 < sVar26) * sVar26 | (ushort)(sVar56 >= sVar26) * sVar56;
  sVar26 = auVar54._8_2_;
  sVar56 = auVar25._8_2_;
  uStack_e0 = (ushort)(sVar56 < sVar26) * sVar26 | (ushort)(sVar56 >= sVar26) * sVar56;
  sVar26 = auVar54._10_2_;
  sVar56 = auVar25._10_2_;
  uStack_de = (ushort)(sVar56 < sVar26) * sVar26 | (ushort)(sVar56 >= sVar26) * sVar56;
  sVar26 = auVar54._12_2_;
  sVar56 = auVar25._12_2_;
  sVar30 = auVar25._14_2_;
  uStack_dc = (ushort)(sVar56 < sVar26) * sVar26 | (ushort)(sVar56 >= sVar26) * sVar56;
  sVar26 = auVar54._14_2_;
  uStack_da = (ushort)(sVar30 < sVar26) * sVar26 | (ushort)(sVar30 >= sVar26) * sVar30;
  uVar41 = ((short)uVar41 < (short)local_e8) * local_e8 |
           ((short)uVar41 >= (short)local_e8) * uVar41;
  uVar45 = ((short)uVar45 < (short)uStack_e6) * uStack_e6 |
           ((short)uVar45 >= (short)uStack_e6) * uVar45;
  uVar46 = ((short)uVar46 < (short)uStack_e4) * uStack_e4 |
           ((short)uVar46 >= (short)uStack_e4) * uVar46;
  uVar47 = ((short)uVar47 < (short)uStack_e2) * uStack_e2 |
           ((short)uVar47 >= (short)uStack_e2) * uVar47;
  uVar48 = ((short)uVar48 < (short)uStack_e0) * uStack_e0 |
           ((short)uVar48 >= (short)uStack_e0) * uVar48;
  uVar49 = ((short)uVar49 < (short)uStack_de) * uStack_de |
           ((short)uVar49 >= (short)uStack_de) * uVar49;
  uVar50 = ((short)uVar50 < (short)uStack_dc) * uStack_dc |
           ((short)uVar50 >= (short)uStack_dc) * uVar50;
  uVar51 = ((short)uVar51 < (short)uStack_da) * uStack_da |
           ((short)uVar51 >= (short)uStack_da) * uVar51;
  auVar43 = psubusw(auVar85,local_68);
  auVar54 = psubusw(local_68,auVar85);
  auVar54 = auVar54 | auVar43;
  auVar43 = psubusw(auVar85,auVar86);
  auVar85 = psubusw(auVar86,auVar85);
  auVar85 = auVar85 | auVar43;
  sVar26 = auVar54._0_2_;
  sVar56 = auVar85._0_2_;
  uVar84 = (ushort)(sVar56 < sVar26) * sVar26 | (ushort)(sVar56 >= sVar26) * sVar56;
  sVar26 = auVar54._2_2_;
  sVar56 = auVar85._2_2_;
  uVar87 = (ushort)(sVar56 < sVar26) * sVar26 | (ushort)(sVar56 >= sVar26) * sVar56;
  sVar26 = auVar54._4_2_;
  sVar56 = auVar85._4_2_;
  uVar89 = (ushort)(sVar56 < sVar26) * sVar26 | (ushort)(sVar56 >= sVar26) * sVar56;
  sVar26 = auVar54._6_2_;
  sVar56 = auVar85._6_2_;
  uVar91 = (ushort)(sVar56 < sVar26) * sVar26 | (ushort)(sVar56 >= sVar26) * sVar56;
  sVar26 = auVar54._8_2_;
  sVar56 = auVar85._8_2_;
  uVar93 = (ushort)(sVar56 < sVar26) * sVar26 | (ushort)(sVar56 >= sVar26) * sVar56;
  sVar26 = auVar54._10_2_;
  sVar56 = auVar85._10_2_;
  uVar94 = (ushort)(sVar56 < sVar26) * sVar26 | (ushort)(sVar56 >= sVar26) * sVar56;
  sVar26 = auVar54._12_2_;
  sVar56 = auVar85._12_2_;
  sVar30 = auVar85._14_2_;
  uVar96 = (ushort)(sVar56 < sVar26) * sVar26 | (ushort)(sVar56 >= sVar26) * sVar56;
  sVar26 = auVar54._14_2_;
  uVar98 = (ushort)(sVar30 < sVar26) * sVar26 | (ushort)(sVar30 >= sVar26) * sVar30;
  uVar41 = ((short)uVar84 < (short)uVar41) * uVar41 | ((short)uVar84 >= (short)uVar41) * uVar84;
  uVar45 = ((short)uVar87 < (short)uVar45) * uVar45 | ((short)uVar87 >= (short)uVar45) * uVar87;
  uVar46 = ((short)uVar89 < (short)uVar46) * uVar46 | ((short)uVar89 >= (short)uVar46) * uVar89;
  uVar47 = ((short)uVar91 < (short)uVar47) * uVar47 | ((short)uVar91 >= (short)uVar47) * uVar91;
  uVar48 = ((short)uVar93 < (short)uVar48) * uVar48 | ((short)uVar93 >= (short)uVar48) * uVar93;
  uVar49 = ((short)uVar94 < (short)uVar49) * uVar49 | ((short)uVar94 >= (short)uVar49) * uVar94;
  uVar50 = ((short)uVar96 < (short)uVar50) * uVar50 | ((short)uVar96 >= (short)uVar50) * uVar96;
  uVar51 = ((short)uVar98 < (short)uVar51) * uVar51 | ((short)uVar98 >= (short)uVar51) * uVar98;
  sVar26 = auVar24._0_2_;
  auVar86._0_2_ = (ushort)((short)uVar41 < sVar26) * sVar26 | ((short)uVar41 >= sVar26) * uVar41;
  sVar26 = auVar24._2_2_;
  auVar86._2_2_ = (ushort)((short)uVar45 < sVar26) * sVar26 | ((short)uVar45 >= sVar26) * uVar45;
  sVar26 = auVar24._4_2_;
  auVar86._4_2_ = (ushort)((short)uVar46 < sVar26) * sVar26 | ((short)uVar46 >= sVar26) * uVar46;
  sVar26 = auVar24._6_2_;
  auVar86._6_2_ = (ushort)((short)uVar47 < sVar26) * sVar26 | ((short)uVar47 >= sVar26) * uVar47;
  sVar26 = auVar24._8_2_;
  auVar86._8_2_ = (ushort)((short)uVar48 < sVar26) * sVar26 | ((short)uVar48 >= sVar26) * uVar48;
  sVar26 = auVar24._10_2_;
  auVar86._10_2_ = (ushort)((short)uVar49 < sVar26) * sVar26 | ((short)uVar49 >= sVar26) * uVar49;
  sVar26 = auVar24._12_2_;
  auVar86._12_2_ = (ushort)((short)uVar50 < sVar26) * sVar26 | ((short)uVar50 >= sVar26) * uVar50;
  sVar26 = auVar24._14_2_;
  auVar86._14_2_ = (ushort)((short)uVar51 < sVar26) * sVar26 | ((short)uVar51 >= sVar26) * uVar51;
  auVar43 = psubusw(auVar86,(undefined1  [16])limit0);
  local_d8 = -(ushort)(auVar43._0_2_ == 0);
  sStack_d6 = -(ushort)(auVar43._2_2_ == 0);
  sStack_d4 = -(ushort)(auVar43._4_2_ == 0);
  sStack_d2 = -(ushort)(auVar43._6_2_ == 0);
  sStack_d0 = -(ushort)(auVar43._8_2_ == 0);
  sStack_ce = -(ushort)(auVar43._10_2_ == 0);
  sStack_cc = -(ushort)(auVar43._12_2_ == 0);
  sStack_ca = -(ushort)(auVar43._14_2_ == 0);
  local_b8 = local_d8;
  sStack_b6 = sStack_d6;
  sStack_b4 = sStack_d4;
  sStack_b2 = sStack_d2;
  sStack_b0 = sStack_d0;
  sStack_ae = sStack_ce;
  sStack_ac = sStack_cc;
  sStack_aa = sStack_ca;
  local_78 = alVar19;
  p_1[0] = alVar18;
  highbd_filter4_dual_sse2
            (p_1,&local_78,&local_108,&local_128,(__m128i *)&local_b8,&thresh0,bd,&t80);
  auVar43 = psubusw(auVar29,(undefined1  [16])alVar20);
  auVar54 = psubusw((undefined1  [16])alVar20,auVar29);
  auVar54 = auVar54 | auVar43;
  auVar43 = psubusw(auVar74,auVar44);
  auVar85 = psubusw(auVar44,auVar74);
  auVar85 = auVar85 | auVar43;
  sVar26 = auVar54._0_2_;
  sVar56 = auVar85._0_2_;
  uVar41 = (ushort)(sVar56 < sVar26) * sVar26 | (ushort)(sVar56 >= sVar26) * sVar56;
  sVar26 = auVar54._2_2_;
  sVar56 = auVar85._2_2_;
  uVar45 = (ushort)(sVar56 < sVar26) * sVar26 | (ushort)(sVar56 >= sVar26) * sVar56;
  sVar26 = auVar54._4_2_;
  sVar56 = auVar85._4_2_;
  uVar46 = (ushort)(sVar56 < sVar26) * sVar26 | (ushort)(sVar56 >= sVar26) * sVar56;
  sVar26 = auVar54._6_2_;
  sVar56 = auVar85._6_2_;
  uVar47 = (ushort)(sVar56 < sVar26) * sVar26 | (ushort)(sVar56 >= sVar26) * sVar56;
  sVar26 = auVar54._8_2_;
  sVar56 = auVar85._8_2_;
  uVar48 = (ushort)(sVar56 < sVar26) * sVar26 | (ushort)(sVar56 >= sVar26) * sVar56;
  sVar26 = auVar54._10_2_;
  sVar56 = auVar85._10_2_;
  uVar49 = (ushort)(sVar56 < sVar26) * sVar26 | (ushort)(sVar56 >= sVar26) * sVar56;
  sVar26 = auVar54._12_2_;
  sVar56 = auVar85._12_2_;
  sVar30 = auVar85._14_2_;
  uVar50 = (ushort)(sVar56 < sVar26) * sVar26 | (ushort)(sVar56 >= sVar26) * sVar56;
  sVar26 = auVar54._14_2_;
  uVar51 = (ushort)(sVar30 < sVar26) * sVar26 | (ushort)(sVar30 >= sVar26) * sVar30;
  uVar84 = ((short)uVar41 < (short)local_e8) * local_e8 |
           ((short)uVar41 >= (short)local_e8) * uVar41;
  uVar87 = ((short)uVar45 < (short)uStack_e6) * uStack_e6 |
           ((short)uVar45 >= (short)uStack_e6) * uVar45;
  uVar89 = ((short)uVar46 < (short)uStack_e4) * uStack_e4 |
           ((short)uVar46 >= (short)uStack_e4) * uVar46;
  uVar91 = ((short)uVar47 < (short)uStack_e2) * uStack_e2 |
           ((short)uVar47 >= (short)uStack_e2) * uVar47;
  uVar93 = ((short)uVar48 < (short)uStack_e0) * uStack_e0 |
           ((short)uVar48 >= (short)uStack_e0) * uVar48;
  uVar94 = ((short)uVar49 < (short)uStack_de) * uStack_de |
           ((short)uVar49 >= (short)uStack_de) * uVar49;
  uVar96 = ((short)uVar50 < (short)uStack_dc) * uStack_dc |
           ((short)uVar50 >= (short)uStack_dc) * uVar50;
  uVar98 = ((short)uVar51 < (short)uStack_da) * uStack_da |
           ((short)uVar51 >= (short)uStack_da) * uVar51;
  auVar43 = psubusw(auVar28,(undefined1  [16])alVar20);
  auVar54 = psubusw((undefined1  [16])alVar20,auVar28);
  auVar54 = auVar54 | auVar43;
  auVar85 = psubusw(auVar52,auVar44);
  auVar43 = psubusw(auVar44,auVar52);
  auVar43 = auVar43 | auVar85;
  sVar26 = auVar54._0_2_;
  sVar56 = auVar43._0_2_;
  uVar41 = (ushort)(sVar56 < sVar26) * sVar26 | (ushort)(sVar56 >= sVar26) * sVar56;
  sVar26 = auVar54._2_2_;
  sVar56 = auVar43._2_2_;
  uVar45 = (ushort)(sVar56 < sVar26) * sVar26 | (ushort)(sVar56 >= sVar26) * sVar56;
  sVar26 = auVar54._4_2_;
  sVar56 = auVar43._4_2_;
  uVar46 = (ushort)(sVar56 < sVar26) * sVar26 | (ushort)(sVar56 >= sVar26) * sVar56;
  sVar26 = auVar54._6_2_;
  sVar56 = auVar43._6_2_;
  uVar47 = (ushort)(sVar56 < sVar26) * sVar26 | (ushort)(sVar56 >= sVar26) * sVar56;
  sVar26 = auVar54._8_2_;
  sVar56 = auVar43._8_2_;
  uVar48 = (ushort)(sVar56 < sVar26) * sVar26 | (ushort)(sVar56 >= sVar26) * sVar56;
  sVar26 = auVar54._10_2_;
  sVar56 = auVar43._10_2_;
  uVar49 = (ushort)(sVar56 < sVar26) * sVar26 | (ushort)(sVar56 >= sVar26) * sVar56;
  sVar26 = auVar54._12_2_;
  sVar56 = auVar43._12_2_;
  sVar30 = auVar43._14_2_;
  uVar50 = (ushort)(sVar56 < sVar26) * sVar26 | (ushort)(sVar56 >= sVar26) * sVar56;
  sVar26 = auVar54._14_2_;
  uVar51 = (ushort)(sVar30 < sVar26) * sVar26 | (ushort)(sVar30 >= sVar26) * sVar30;
  auVar54._0_2_ =
       ((short)uVar41 < (short)uVar84) * uVar84 | ((short)uVar41 >= (short)uVar84) * uVar41;
  auVar54._2_2_ =
       ((short)uVar45 < (short)uVar87) * uVar87 | ((short)uVar45 >= (short)uVar87) * uVar45;
  auVar54._4_2_ =
       ((short)uVar46 < (short)uVar89) * uVar89 | ((short)uVar46 >= (short)uVar89) * uVar46;
  auVar54._6_2_ =
       ((short)uVar47 < (short)uVar91) * uVar91 | ((short)uVar47 >= (short)uVar91) * uVar47;
  auVar54._8_2_ =
       ((short)uVar48 < (short)uVar93) * uVar93 | ((short)uVar48 >= (short)uVar93) * uVar48;
  auVar54._10_2_ =
       ((short)uVar49 < (short)uVar94) * uVar94 | ((short)uVar49 >= (short)uVar94) * uVar49;
  auVar54._12_2_ =
       ((short)uVar50 < (short)uVar96) * uVar96 | ((short)uVar50 >= (short)uVar96) * uVar50;
  auVar54._14_2_ =
       ((short)uVar51 < (short)uVar98) * uVar98 | ((short)uVar51 >= (short)uVar98) * uVar51;
  auVar43 = psllw(_DAT_00430120,ZEXT416(bd - 8));
  auVar43 = psubusw(auVar54,auVar43);
  auVar85._0_2_ = -(ushort)(auVar43._0_2_ == 0);
  auVar85._2_2_ = -(ushort)(auVar43._2_2_ == 0);
  auVar85._4_2_ = -(ushort)(auVar43._4_2_ == 0);
  auVar85._6_2_ = -(ushort)(auVar43._6_2_ == 0);
  auVar85._8_2_ = -(ushort)(auVar43._8_2_ == 0);
  auVar85._10_2_ = -(ushort)(auVar43._10_2_ == 0);
  auVar85._12_2_ = -(ushort)(auVar43._12_2_ == 0);
  auVar85._14_2_ = -(ushort)(auVar43._14_2_ == 0);
  auVar43._2_2_ = sStack_d6;
  auVar43._0_2_ = local_d8;
  auVar43._4_2_ = sStack_d4;
  auVar43._6_2_ = sStack_d2;
  auVar43._8_2_ = sStack_d0;
  auVar43._10_2_ = sStack_ce;
  auVar43._12_2_ = sStack_cc;
  auVar43._14_2_ = sStack_ca;
  auVar85 = auVar85 & auVar43;
  if ((((((((((((((((auVar85 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar85 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar85 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar85 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar85 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar85 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar85 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar85 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar85 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar85 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar85 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar85 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar85 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
       (auVar85 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar85 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar85[0xf] < '\0') {
    auVar52._8_4_ = 0xffffffff;
    auVar52._0_8_ = 0xffffffffffffffff;
    auVar52._12_4_ = 0xffffffff;
    sVar56 = (short)uVar4;
    sVar26 = sVar56 + (short)uVar8;
    sVar59 = (short)((ulong)uVar4 >> 0x10);
    sVar88 = (short)((ulong)uVar8 >> 0x10);
    sVar30 = sVar59 + sVar88;
    sVar62 = (short)((ulong)uVar4 >> 0x20);
    sVar90 = (short)((ulong)uVar8 >> 0x20);
    sVar31 = sVar62 + sVar90;
    sVar65 = (short)((ulong)uVar4 >> 0x30);
    sVar92 = (short)((ulong)uVar8 >> 0x30);
    sVar32 = sVar65 + sVar92;
    sVar34 = (short)uVar5;
    sVar33 = sVar34 + (short)uVar9;
    sVar36 = (short)((ulong)uVar5 >> 0x10);
    sVar95 = (short)((ulong)uVar9 >> 0x10);
    sVar35 = sVar36 + sVar95;
    sVar38 = (short)((ulong)uVar5 >> 0x20);
    sVar40 = (short)((ulong)uVar5 >> 0x30);
    sVar97 = (short)((ulong)uVar9 >> 0x20);
    sVar37 = sVar38 + sVar97;
    sVar99 = (short)((ulong)uVar9 >> 0x30);
    sVar39 = sVar40 + sVar99;
    sVar101 = (short)((ulong)lVar14 >> 0x10);
    sVar102 = (short)((ulong)lVar14 >> 0x20);
    sVar103 = (short)((ulong)lVar14 >> 0x30);
    sVar104 = (short)((ulong)lVar15 >> 0x10);
    sVar105 = (short)((ulong)lVar15 >> 0x20);
    sVar106 = (short)((ulong)lVar15 >> 0x30);
    sVar53 = sVar56 + local_1a8 + sVar26 + (short)lVar14 + 4;
    sVar55 = sVar59 + sStack_1a6 + sVar30 + sVar101 + 4;
    sVar57 = sVar62 + sStack_1a4 + sVar31 + sVar102 + 4;
    sVar58 = sVar65 + sStack_1a2 + sVar32 + sVar103 + 4;
    sVar60 = sVar34 + sStack_1a0 + sVar33 + (short)lVar15 + 4;
    sVar61 = sVar36 + sStack_19e + sVar35 + sVar104 + 4;
    sVar63 = sVar38 + sStack_19c + sVar37 + sVar105 + 4;
    sVar64 = sVar40 + sStack_19a + sVar39 + sVar106 + 4;
    auVar52 = auVar52 ^ auVar85;
    sVar75 = (short)uVar12;
    sVar77 = (short)((ulong)uVar12 >> 0x10);
    sVar78 = (short)((ulong)uVar12 >> 0x20);
    sVar79 = (short)((ulong)uVar12 >> 0x30);
    sVar80 = (short)uVar13;
    sVar81 = (short)((ulong)uVar13 >> 0x10);
    sVar82 = (short)((ulong)uVar13 >> 0x20);
    sVar83 = (short)((ulong)uVar13 >> 0x30);
    auVar28._0_2_ = (ushort)(sVar26 + sVar75 + sVar53) >> 3;
    auVar28._2_2_ = (ushort)(sVar30 + sVar77 + sVar55) >> 3;
    auVar28._4_2_ = (ushort)(sVar31 + sVar78 + sVar57) >> 3;
    auVar28._6_2_ = (ushort)(sVar32 + sVar79 + sVar58) >> 3;
    auVar28._8_2_ = (ushort)(sVar33 + sVar80 + sVar60) >> 3;
    auVar28._10_2_ = (ushort)(sVar35 + sVar81 + sVar61) >> 3;
    auVar28._12_2_ = (ushort)(sVar37 + sVar82 + sVar63) >> 3;
    auVar28._14_2_ = (ushort)(sVar39 + sVar83 + sVar64) >> 3;
    sVar66 = sVar75 + local_198;
    sVar67 = sVar77 + sStack_196;
    sVar68 = sVar78 + sStack_194;
    sVar69 = sVar79 + sStack_192;
    sVar70 = sVar80 + sStack_190;
    sVar71 = sVar81 + sStack_18e;
    sVar72 = sVar82 + sStack_18c;
    sVar73 = sVar83 + sStack_18a;
    auVar44._0_2_ = (ushort)(sVar66 + local_1a8 + sVar53) >> 3;
    auVar44._2_2_ = (ushort)(sVar67 + sStack_1a6 + sVar55) >> 3;
    auVar44._4_2_ = (ushort)(sVar68 + sStack_1a4 + sVar57) >> 3;
    auVar44._6_2_ = (ushort)(sVar69 + sStack_1a2 + sVar58) >> 3;
    auVar44._8_2_ = (ushort)(sVar70 + sStack_1a0 + sVar60) >> 3;
    auVar44._10_2_ = (ushort)(sVar71 + sStack_19e + sVar61) >> 3;
    auVar44._12_2_ = (ushort)(sVar72 + sStack_19c + sVar63) >> 3;
    auVar44._14_2_ = (ushort)(sVar73 + sStack_19a + sVar64) >> 3;
    sVar26 = (sVar53 - sVar56) + (short)uVar10;
    sVar107 = (short)((ulong)uVar10 >> 0x10);
    sVar30 = (sVar55 - sVar59) + sVar107;
    sVar108 = (short)((ulong)uVar10 >> 0x20);
    sVar31 = (sVar57 - sVar62) + sVar108;
    sVar109 = (short)((ulong)uVar10 >> 0x30);
    sVar32 = (sVar58 - sVar65) + sVar109;
    sVar33 = (sVar60 - sVar34) + (short)uVar11;
    sVar110 = (short)((ulong)uVar11 >> 0x10);
    sVar35 = (sVar61 - sVar36) + sVar110;
    sVar61 = (short)((ulong)uVar11 >> 0x20);
    sVar37 = (sVar63 - sVar38) + sVar61;
    sVar63 = (short)((ulong)uVar11 >> 0x30);
    sVar39 = (sVar64 - sVar40) + sVar63;
    auVar100._0_2_ = (ushort)((short)lVar14 + sVar66 + sVar26) >> 3;
    auVar100._2_2_ = (ushort)(sVar101 + sVar67 + sVar30) >> 3;
    auVar100._4_2_ = (ushort)(sVar102 + sVar68 + sVar31) >> 3;
    auVar100._6_2_ = (ushort)(sVar103 + sVar69 + sVar32) >> 3;
    auVar100._8_2_ = (ushort)((short)lVar15 + sVar70 + sVar33) >> 3;
    auVar100._10_2_ = (ushort)(sVar104 + sVar71 + sVar35) >> 3;
    auVar100._12_2_ = (ushort)(sVar105 + sVar72 + sVar37) >> 3;
    auVar100._14_2_ = (ushort)(sVar106 + sVar73 + sVar39) >> 3;
    sVar53 = (short)uVar6;
    sVar26 = (sVar26 - sVar56) + sVar53;
    sVar55 = (short)((ulong)uVar6 >> 0x10);
    sVar56 = (sVar30 - sVar59) + sVar55;
    sVar57 = (short)((ulong)uVar6 >> 0x20);
    sVar30 = (sVar31 - sVar62) + sVar57;
    sVar58 = (short)((ulong)uVar6 >> 0x30);
    sVar59 = (sVar32 - sVar65) + sVar58;
    sVar60 = (short)uVar7;
    sVar31 = (sVar33 - sVar34) + sVar60;
    sVar33 = (short)((ulong)uVar7 >> 0x10);
    sVar62 = (sVar35 - sVar36) + sVar33;
    sVar34 = (short)((ulong)uVar7 >> 0x20);
    sVar32 = (sVar37 - sVar38) + sVar34;
    sVar35 = (short)((ulong)uVar7 >> 0x30);
    sVar65 = (sVar39 - sVar40) + sVar35;
    auVar76._0_2_ = (ushort)(sVar75 + sVar66 + sVar26) >> 3;
    auVar76._2_2_ = (ushort)(sVar77 + sVar67 + sVar56) >> 3;
    auVar76._4_2_ = (ushort)(sVar78 + sVar68 + sVar30) >> 3;
    auVar76._6_2_ = (ushort)(sVar79 + sVar69 + sVar59) >> 3;
    auVar76._8_2_ = (ushort)(sVar80 + sVar70 + sVar31) >> 3;
    auVar76._10_2_ = (ushort)(sVar81 + sVar71 + sVar62) >> 3;
    auVar76._12_2_ = (ushort)(sVar82 + sVar72 + sVar32) >> 3;
    auVar76._14_2_ = (ushort)(sVar83 + sVar73 + sVar65) >> 3;
    sVar26 = (sVar26 - (short)uVar8) + sVar53;
    sVar56 = (sVar56 - sVar88) + sVar55;
    sVar30 = (sVar30 - sVar90) + sVar57;
    sVar59 = (sVar59 - sVar92) + sVar58;
    sVar31 = (sVar31 - (short)uVar9) + sVar60;
    sVar62 = (sVar62 - sVar95) + sVar33;
    sVar32 = (sVar32 - sVar97) + sVar34;
    sVar65 = (sVar65 - sVar99) + sVar35;
    auVar42._0_2_ = (ushort)(local_198 + sVar66 + sVar26) >> 3;
    auVar42._2_2_ = (ushort)(sStack_196 + sVar67 + sVar56) >> 3;
    auVar42._4_2_ = (ushort)(sStack_194 + sVar68 + sVar30) >> 3;
    auVar42._6_2_ = (ushort)(sStack_192 + sVar69 + sVar59) >> 3;
    auVar42._8_2_ = (ushort)(sStack_190 + sVar70 + sVar31) >> 3;
    auVar42._10_2_ = (ushort)(sStack_18e + sVar71 + sVar62) >> 3;
    auVar42._12_2_ = (ushort)(sStack_18c + sVar72 + sVar32) >> 3;
    auVar42._14_2_ = (ushort)(sStack_18a + sVar73 + sVar65) >> 3;
    auVar24._0_2_ = (ushort)(((sVar53 + (short)uVar10) - local_1a8) + sVar66 + sVar26) >> 3;
    auVar24._2_2_ = (ushort)(((sVar55 + sVar107) - sStack_1a6) + sVar67 + sVar56) >> 3;
    auVar24._4_2_ = (ushort)(((sVar57 + sVar108) - sStack_1a4) + sVar68 + sVar30) >> 3;
    auVar24._6_2_ = (ushort)(((sVar58 + sVar109) - sStack_1a2) + sVar69 + sVar59) >> 3;
    auVar24._8_2_ = (ushort)(((sVar60 + (short)uVar11) - sStack_1a0) + sVar70 + sVar31) >> 3;
    auVar24._10_2_ = (ushort)(((sVar33 + sVar110) - sStack_19e) + sVar71 + sVar62) >> 3;
    auVar24._12_2_ = (ushort)(((sVar34 + sVar61) - sStack_19c) + sVar72 + sVar32) >> 3;
    auVar24._14_2_ = (ushort)(((sVar35 + sVar63) - sStack_19a) + sVar73 + sVar65) >> 3;
    local_128 = (__m128i)(auVar76 & auVar85 | (undefined1  [16])local_128 & auVar52);
    local_118 = auVar42 & auVar85 | local_118 & auVar52;
    local_108 = (__m128i)(auVar100 & auVar85 | (undefined1  [16])local_108 & auVar52);
    local_f8 = auVar44 & auVar85 | local_f8 & auVar52;
    auVar74 = auVar24 & auVar85 | auVar74 & auVar52;
    auVar29 = auVar28 & auVar85 | auVar52 & auVar29;
  }
  *(undefined1 (*) [16])(s + -lVar23) = auVar29;
  *(undefined1 (*) [16])(s + -lVar22) = local_f8;
  *(__m128i *)(s + -lVar21) = local_108;
  *(__m128i *)s = local_128;
  *(undefined1 (*) [16])(s + lVar21) = local_118;
  *(undefined1 (*) [16])(s + lVar22) = auVar74;
  return;
}

Assistant:

void aom_highbd_lpf_horizontal_8_dual_sse2(
    uint16_t *s, int p, const uint8_t *_blimit0, const uint8_t *_limit0,
    const uint8_t *_thresh0, const uint8_t *_blimit1, const uint8_t *_limit1,
    const uint8_t *_thresh1, int bd) {
  __m128i p2, p1, p0, q0, q1, q2, p3, q3;

  p3 = _mm_loadu_si128((__m128i *)(s - 4 * p));
  q3 = _mm_loadu_si128((__m128i *)(s + 3 * p));
  p2 = _mm_loadu_si128((__m128i *)(s - 3 * p));
  q2 = _mm_loadu_si128((__m128i *)(s + 2 * p));
  p1 = _mm_loadu_si128((__m128i *)(s - 2 * p));
  q1 = _mm_loadu_si128((__m128i *)(s + 1 * p));
  p0 = _mm_loadu_si128((__m128i *)(s - 1 * p));
  q0 = _mm_loadu_si128((__m128i *)(s + 0 * p));

  highbd_lpf_internal_8_dual_sse2(&p3, &q3, &p2, &q2, &p1, &q1, &p0, &q0,
                                  _blimit0, _limit0, _thresh0, _blimit1,
                                  _limit1, _thresh1, bd);

  _mm_storeu_si128((__m128i *)(s - 3 * p), p2);
  _mm_storeu_si128((__m128i *)(s - 2 * p), p1);
  _mm_storeu_si128((__m128i *)(s - 1 * p), p0);
  _mm_storeu_si128((__m128i *)(s + 0 * p), q0);
  _mm_storeu_si128((__m128i *)(s + 1 * p), q1);
  _mm_storeu_si128((__m128i *)(s + 2 * p), q2);
}